

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined4 *puVar32;
  long lVar33;
  long lVar34;
  uint _c;
  undefined4 *puVar35;
  _func_int *p_Var36;
  
  p_Var36 = this->_vptr_LSTM_x86[-3];
  _c = (*(int *)(p_Var36 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  uVar31 = (long)((ulong)(uint)((int)((long)*(int *)(p_Var36 + 0x3c +
                                                    (long)&(this->weight_hc_data_packed).data) /
                                     (long)(int)_c) >> 0x1f) << 0x20 |
                 (long)*(int *)(p_Var36 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                 (long)(int)_c & 0xffffffffU) /
           (long)*(int *)(p_Var36 + 0x44 + (long)&(this->weight_hc_data_packed).data);
  uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) / 4;
  iVar17 = (int)uVar31;
  Mat::create(&this->weight_xc_data_packed,iVar17,
              *(int *)(p_Var36 + 0x44 + (long)&(this->weight_hc_data_packed).data),_c,0x10,4,
              (Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              1,_c,0x10,4,(Allocator *)0x0);
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data),
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              _c,0x10,4,(Allocator *)0x0);
  pp_Var3 = this->_vptr_LSTM_x86;
  pvVar24 = (this->weight_xc_data_packed).data;
  iVar1 = (this->weight_xc_data_packed).w;
  sVar4 = (this->weight_xc_data_packed).elemsize;
  pvVar5 = (this->bias_c_data_packed).data;
  sVar6 = (this->bias_c_data_packed).cstep;
  sVar7 = (this->bias_c_data_packed).elemsize;
  iVar2 = (this->weight_hc_data_packed).w;
  pvVar8 = (this->weight_hc_data_packed).data;
  sVar9 = (this->weight_hc_data_packed).elemsize;
  sVar10 = (this->weight_hc_data_packed).cstep;
  uVar27 = 0;
  uVar31 = uVar31 & 0xffffffff;
  if (iVar17 < 1) {
    uVar31 = uVar27;
  }
  sVar11 = (this->weight_xc_data_packed).cstep;
  for (; uVar27 != _c; uVar27 = uVar27 + 1) {
    p_Var36 = pp_Var3[-3];
    lVar25 = (long)*(int *)(&this->field_0x154 + (long)p_Var36);
    lVar12 = *(long *)(&this->field_0x138 + (long)p_Var36);
    lVar29 = *(long *)(&this->field_0x1b0 + (long)p_Var36) * uVar27 *
             *(long *)(&this->field_0x180 + (long)p_Var36) +
             *(long *)(&this->field_0x170 + (long)p_Var36);
    lVar30 = (long)*(int *)(&this->field_0x10c + (long)p_Var36);
    lVar13 = *(long *)(&this->field_0xf0 + (long)p_Var36);
    puVar32 = (undefined4 *)(sVar6 * sVar7 * uVar27 + (long)pvVar5);
    lVar18 = (long)*(int *)(&this->field_0x19c + (long)p_Var36) *
             *(long *)(&this->field_0x180 + (long)p_Var36);
    lVar33 = *(long *)(&this->field_0x168 + (long)p_Var36) * uVar27;
    lVar14 = *(long *)(&this->field_0x128 + (long)p_Var36);
    lVar34 = lVar33 * lVar12 + lVar14;
    lVar19 = *(long *)(&this->field_0x120 + (long)p_Var36) * uVar27;
    lVar15 = *(long *)(&this->field_0xe0 + (long)p_Var36);
    lVar20 = lVar19 * lVar13 + lVar15;
    pvVar23 = pvVar24;
    for (lVar22 = 0; lVar22 < *(int *)(p_Var36 + 0x44 + (long)&(this->weight_hc_data_packed).data);
        lVar22 = lVar22 + 1) {
      *puVar32 = *(undefined4 *)(lVar29 + lVar22 * 4);
      puVar32[1] = *(undefined4 *)(lVar29 + lVar18 + lVar22 * 4);
      puVar32[2] = *(undefined4 *)(lVar29 + lVar18 * 2 + lVar22 * 4);
      puVar32[3] = *(undefined4 *)(lVar18 * 3 + lVar29 + lVar22 * 4);
      iVar17 = *(int *)(pp_Var3[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
      iVar21 = (int)lVar22;
      lVar28 = (long)(iVar17 * 3 + iVar21);
      for (lVar26 = 0; uVar31 * 4 != lVar26; lVar26 = lVar26 + 4) {
        *(undefined4 *)((long)pvVar23 + lVar26 * 4) = *(undefined4 *)(lVar34 + lVar26);
        *(undefined4 *)((long)pvVar23 + lVar26 * 4 + 4) =
             *(undefined4 *)((lVar25 * (iVar17 + iVar21) + lVar33) * lVar12 + lVar14 + lVar26);
        *(undefined4 *)((long)pvVar23 + lVar26 * 4 + 8) =
             *(undefined4 *)(((iVar21 + iVar17 * 2) * lVar25 + lVar33) * lVar12 + lVar14 + lVar26);
        *(undefined4 *)((long)pvVar23 + lVar26 * 4 + 0xc) =
             *(undefined4 *)((lVar25 * lVar28 + lVar33) * lVar12 + lVar14 + lVar26);
      }
      puVar35 = (undefined4 *)
                ((long)pvVar8 + (long)iVar2 * sVar9 * lVar22 + sVar10 * sVar9 * uVar27);
      for (lVar26 = 0; p_Var36 = pp_Var3[-3],
          lVar26 < *(int *)(p_Var36 + 0x38 + (long)&(this->weight_hc_data_packed).data);
          lVar26 = lVar26 + 1) {
        *puVar35 = *(undefined4 *)(lVar20 + lVar26 * 4);
        puVar35[1] = *(undefined4 *)
                      (((iVar17 + iVar21) * lVar30 + lVar19) * lVar13 + lVar15 + lVar26 * 4);
        puVar35[2] = *(undefined4 *)
                      (((iVar17 * 2 + iVar21) * lVar30 + lVar19) * lVar13 + lVar15 + lVar26 * 4);
        puVar35[3] = *(undefined4 *)((lVar28 * lVar30 + lVar19) * lVar13 + lVar15 + lVar26 * 4);
        puVar35 = puVar35 + 4;
      }
      puVar32 = puVar32 + 4;
      lVar34 = lVar34 + lVar12 * lVar25;
      pvVar23 = (void *)((long)pvVar23 + (long)iVar1 * sVar4);
      lVar20 = lVar20 + lVar13 * lVar30;
    }
    pvVar24 = (void *)((long)pvVar24 + sVar11 * sVar4);
  }
  if (opt->lightmode != false) {
    p_Var36 = pp_Var3[-3];
    piVar16 = *(int **)(&this->field_0x130 + (long)p_Var36);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var36) == (long *)0x0) {
          free(*(void **)(&this->field_0x128 + (long)p_Var36));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var36) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x134 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x128 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var36) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var36) = 0;
    p_Var36 = this->_vptr_LSTM_x86[-3];
    piVar16 = *(int **)(&this->field_0x178 + (long)p_Var36);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var36) == (long *)0x0) {
          free(*(void **)(&this->field_0x170 + (long)p_Var36));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var36) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var36) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var36) = 0;
    p_Var36 = this->_vptr_LSTM_x86[-3];
    piVar16 = *(int **)(&this->field_0xe8 + (long)p_Var36);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var36) == (long *)0x0) {
          free(*(void **)(&this->field_0xe0 + (long)p_Var36));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var36) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var36) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var36) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var36) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}